

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O2

int Bdc_DecomposeStepMux(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  uint iVar;
  long local_48;
  
  iVar = 0;
  if (p->pPars->fVerbose == 0) {
    local_48 = 0;
  }
  else {
    local_48 = Abc_Clock();
  }
  do {
    if (p->nVars <= (int)iVar) {
      iVar = 0xffffffff;
LAB_00459d2b:
      if (p->pPars->fVerbose != 0) {
        aVar7 = Abc_Clock();
        p->timeMuxes = p->timeMuxes + (aVar7 - local_48);
      }
      return iVar;
    }
    if ((pIsf->uSupp >> (iVar & 0x1f) & 1) != 0) {
      Kit_TruthCofactor0New(pIsfL->puOn,pIsf->puOn,p->nVars,iVar);
      Kit_TruthCofactor0New(pIsfL->puOff,pIsf->puOff,p->nVars,iVar);
      Kit_TruthCofactor1New(pIsfR->puOn,pIsf->puOn,p->nVars,iVar);
      Kit_TruthCofactor1New(pIsfR->puOff,pIsf->puOff,p->nVars,iVar);
      uVar1 = Kit_TruthSupport(pIsfL->puOn,p->nVars);
      uVar2 = Kit_TruthSupport(pIsfL->puOff,p->nVars);
      uVar3 = Kit_TruthSupport(pIsfR->puOn,p->nVars);
      uVar4 = Kit_TruthSupport(pIsfR->puOff,p->nVars);
      iVar5 = Kit_WordCountOnes(uVar1 & uVar2);
      iVar6 = Kit_WordCountOnes(uVar3 & uVar4);
      if ((uint)(iVar6 + iVar5) < 1000) {
        Kit_TruthCofactor0New(pIsfL->puOn,pIsf->puOn,p->nVars,iVar);
        Kit_TruthCofactor0New(pIsfL->puOff,pIsf->puOff,p->nVars,iVar);
        Kit_TruthCofactor1New(pIsfR->puOn,pIsf->puOn,p->nVars,iVar);
        Kit_TruthCofactor1New(pIsfR->puOff,pIsf->puOff,p->nVars,iVar);
        Bdc_SuppMinimize(p,pIsfL);
        Bdc_SuppMinimize(p,pIsfR);
        goto LAB_00459d2b;
      }
    }
    iVar = iVar + 1;
  } while( true );
}

Assistant:

int Bdc_DecomposeStepMux( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    int Var, VarMin, nSuppMin, nSuppCur;
    unsigned uSupp0, uSupp1;
    abctime clk = 0; // Suppress "might be used uninitialized"
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    VarMin = -1;
    nSuppMin = 1000;
	for ( Var = 0; Var < p->nVars; Var++ )
    {
        if ( (pIsf->uSupp & (1 << Var)) == 0 )
            continue;
        Kit_TruthCofactor0New( pIsfL->puOn,  pIsf->puOn,  p->nVars, Var );
        Kit_TruthCofactor0New( pIsfL->puOff, pIsf->puOff, p->nVars, Var );
        Kit_TruthCofactor1New( pIsfR->puOn,  pIsf->puOn,  p->nVars, Var );
        Kit_TruthCofactor1New( pIsfR->puOff, pIsf->puOff, p->nVars, Var );
        uSupp0 = Kit_TruthSupport( pIsfL->puOn, p->nVars ) & Kit_TruthSupport( pIsfL->puOff, p->nVars );
        uSupp1 = Kit_TruthSupport( pIsfR->puOn, p->nVars ) & Kit_TruthSupport( pIsfR->puOff, p->nVars );
        nSuppCur = Kit_WordCountOnes(uSupp0) + Kit_WordCountOnes(uSupp1);  
        if ( nSuppMin > nSuppCur )
        {
            nSuppMin = nSuppCur;
            VarMin = Var;
            break;
        }
    }
    if ( VarMin >= 0 )
    {
        Kit_TruthCofactor0New( pIsfL->puOn,  pIsf->puOn,  p->nVars, VarMin );
        Kit_TruthCofactor0New( pIsfL->puOff, pIsf->puOff, p->nVars, VarMin );
        Kit_TruthCofactor1New( pIsfR->puOn,  pIsf->puOn,  p->nVars, VarMin );
        Kit_TruthCofactor1New( pIsfR->puOff, pIsf->puOff, p->nVars, VarMin );
        Bdc_SuppMinimize( p, pIsfL );
        Bdc_SuppMinimize( p, pIsfR );
    }
    if ( p->pPars->fVerbose )
        p->timeMuxes += Abc_Clock() - clk;
    return VarMin;
}